

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interleaved_sudoku.cpp
# Opt level: O1

void __thiscall InterleavedSudoku::permuteNumbers(InterleavedSudoku *this)

{
  Field *pFVar1;
  int iVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  vector<int,_std::allocator<int>_> permutation;
  allocator_type local_39;
  vector<int,_std::allocator<int>_> local_38;
  
  std::vector<int,_std::allocator<int>_>::vector
            (&local_38,(long)(this->super_Sudoku).squared_size_,&local_39);
  if (0 < (this->super_Sudoku).squared_size_) {
    lVar6 = 0;
    do {
      lVar3 = lVar6 + 1;
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] = (int)lVar3;
      lVar6 = lVar3;
    } while (lVar3 < (this->super_Sudoku).squared_size_);
  }
  if (0 < (this->super_Sudoku).squared_size_) {
    iVar4 = 0;
    lVar6 = 0;
    do {
      iVar2 = rand();
      lVar3 = iVar2 % ((this->super_Sudoku).squared_size_ + iVar4) + lVar6;
      iVar2 = local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[lVar6];
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar6] =
           local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[lVar3];
      local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[lVar3] = iVar2;
      lVar6 = lVar6 + 1;
      iVar4 = iVar4 + -1;
    } while (lVar6 < (this->super_Sudoku).squared_size_);
  }
  if (0 < (this->super_Sudoku).squared_size_) {
    iVar4 = 0;
    do {
      iVar2 = (this->super_Sudoku).squared_size_;
      if (0 < iVar2) {
        iVar5 = 0;
        do {
          iVar2 = Field::value((this->super_Sudoku).fields_.
                               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar2 * iVar5 + iVar4].
                               super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (0 < iVar2) {
            pFVar1 = (this->super_Sudoku).fields_.
                     super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(this->super_Sudoku).squared_size_ * iVar5 + iVar4].
                     super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar2 = Field::value(pFVar1);
            Field::setValue(pFVar1,local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[(long)iVar2 + -1]);
          }
          iVar2 = (this->super_Sudoku).squared_size_;
          iVar2 = Field::value((this->super_Sudoku).fields_.
                               super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(iVar5 + iVar2) * iVar2 + iVar4].
                               super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          if (0 < iVar2) {
            iVar2 = (this->super_Sudoku).squared_size_;
            pFVar1 = (this->super_Sudoku).fields_.
                     super__Vector_base<std::shared_ptr<Field>,_std::allocator<std::shared_ptr<Field>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[(iVar5 + iVar2) * iVar2 + iVar4].
                     super___shared_ptr<Field,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            iVar2 = Field::value(pFVar1);
            Field::setValue(pFVar1,local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[(long)iVar2 + -1]);
          }
          iVar5 = iVar5 + 1;
          iVar2 = (this->super_Sudoku).squared_size_;
        } while (iVar5 < iVar2);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < (this->super_Sudoku).squared_size_);
  }
  if (local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void InterleavedSudoku::permuteNumbers()
{
  //generate random permutation
  //srand(std::time(NULL));
  std::vector<int> permutation(squared_size_);
  for(int i=0; i<squared_size_; i++)
  {
    permutation[i] = i+1;
  }

  for(int i=0; i<squared_size_; i++)
  {
    int index = rand() % (squared_size_-i) + i;
    std::swap(permutation[i], permutation[index]);
  }

  for(int x = 0; x < squared_size_; x++)
  {
    for (int y = 0; y < squared_size_; y++)
    {
      if(fields_[index(x,y,0)]->value() > 0)
        fields_[index(x,y,0)]->setValue(permutation[fields_[index(x,y,0)]->value()-1]);
      if(fields_[index(x,y,1)]->value() > 0)
        fields_[index(x,y,1)]->setValue(permutation[fields_[index(x,y,1)]->value()-1]);
    }
  }
}